

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

void Fxu_HeapDoubleMoveDn(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **pDiv2;
  Fxu_Double **pDiv2_00;
  Fxu_Double **local_30;
  Fxu_Double **ppDiv;
  Fxu_Double **ppChild2;
  Fxu_Double **ppChild1;
  Fxu_Double *pDiv_local;
  Fxu_HeapDouble *p_local;
  
  local_30 = p->pTree + pDiv->HNum;
  while( true ) {
    while( true ) {
      if (p->nItems < (*local_30)->HNum * 2) {
        return;
      }
      pDiv2 = p->pTree + ((*local_30)->HNum << 1);
      if ((*local_30)->HNum * 2 + 1 <= p->nItems) break;
      if ((*pDiv2)->Weight <= (*local_30)->Weight) {
        return;
      }
      Fxu_HeapDoubleSwap(local_30,pDiv2);
      local_30 = pDiv2;
    }
    pDiv2_00 = p->pTree + ((*local_30)->HNum * 2 + 1);
    if (((*pDiv2)->Weight <= (*local_30)->Weight) && ((*pDiv2_00)->Weight <= (*local_30)->Weight))
    break;
    if ((*pDiv2)->Weight < (*pDiv2_00)->Weight) {
      Fxu_HeapDoubleSwap(local_30,pDiv2_00);
      local_30 = pDiv2_00;
    }
    else {
      Fxu_HeapDoubleSwap(local_30,pDiv2);
      local_30 = pDiv2;
    }
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveDn( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
	Fxu_Double ** ppChild1, ** ppChild2, ** ppDiv;
	ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
	while ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,*ppDiv) )
	{ // if Child1 does not exist, Child2 also does not exists

		// get the children
		ppChild1 = &FXU_HEAP_DOUBLE_CHILD1(p,*ppDiv);
        if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,*ppDiv) )
        {
            ppChild2 = &FXU_HEAP_DOUBLE_CHILD2(p,*ppDiv);

            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
            { // Div is larger than both, skip
                break;
            }
            else
            { // Div is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild2) )
                {
			        Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
		            // update the pointer
		            ppDiv = ppChild1;
                }
                else
                {
			        Fxu_HeapDoubleSwap( ppDiv, ppChild2 );
		            // update the pointer
		            ppDiv = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) >= FXU_HEAP_DOUBLE_WEIGHT(*ppChild1) )
            { // Div is larger than Child1, skip
                break;
            }
            else
            { // Div is smaller than Child1, then swap them
			    Fxu_HeapDoubleSwap( ppDiv, ppChild1 );
		        // update the pointer
		        ppDiv = ppChild1;
            }
        }
	}
}